

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O3

QNetworkReply * __thiscall
QNetworkAccessManager::createRequest
          (QNetworkAccessManager *this,Operation op,QNetworkRequest *originalReq,
          QIODevice *outgoingData)

{
  QNetworkAccessManagerPrivate *this_00;
  QNetworkReplyImplPrivate *pQVar1;
  Data *pDVar2;
  QNetworkCookieJar *pQVar3;
  QAnyStringView value;
  QAnyStringView newValue;
  QArrayData *pQVar4;
  Operation op_00;
  undefined8 uVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  milliseconds mVar10;
  QNetworkReplyFileImpl *this_01;
  Data *pDVar11;
  QNetworkAccessCacheBackend *this_02;
  char16_t (*pacVar12) [17];
  QObject *pQVar13;
  long in_FS_OFFSET;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QLatin1String QVar17;
  QByteArrayView QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QUrl stsUrl;
  QHttpHeaders h;
  QNetworkRequest request;
  QNetworkRequest req;
  char16_t httpSchemes [5] [17];
  QNetworkRequest local_150;
  QNetworkRequest local_148;
  QNetworkRequest local_140;
  QArrayData *local_138;
  storage_type_conflict *psStack_130;
  undefined1 *local_128;
  QNetworkRequest local_118;
  Operation local_10c;
  anon_union_24_3_e3d07ef4_for_data local_108 [7];
  char16_t local_5e [3];
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkAccessManagerPrivate **)(this + 8);
  local_118.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  local_10c = op;
  QNetworkRequest::QNetworkRequest(&local_118,originalReq);
  if (*(int *)(*(long *)(this + 8) + 0xa4) != 1) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (void *)0x0;
    local_58._16_8_ = 0;
    local_40 = 2;
    QNetworkRequest::attribute
              ((QVariant *)local_108,&local_118,RedirectPolicyAttribute,(QVariant *)&local_58);
    cVar6 = QVariant::isNull();
    QVariant::~QVariant((QVariant *)local_108);
    QVariant::~QVariant((QVariant *)&local_58);
    if (cVar6 != '\0') {
      QVariant::QVariant((QVariant *)local_108,*(int *)(*(long *)(this + 8) + 0xa4));
      QNetworkRequest::setAttribute(&local_118,RedirectPolicyAttribute,(QVariant *)local_108);
      QVariant::~QVariant((QVariant *)local_108);
    }
  }
  mVar10 = QNetworkRequest::transferTimeoutAsDuration(&local_118);
  if (mVar10.__r == 0) {
    QNetworkRequest::setTransferTimeout
              (&local_118,(milliseconds)*(rep *)(*(long *)(this + 8) + 0x100));
  }
  if (*(char *)(*(long *)(this + 8) + 0xf9) == '\x01') {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (void *)0x0;
    local_58._16_8_ = 0;
    local_40 = 2;
    QNetworkRequest::attribute
              ((QVariant *)local_108,&local_118,AutoDeleteReplyOnFinishAttribute,
               (QVariant *)&local_58);
    cVar6 = QVariant::isNull();
    QVariant::~QVariant((QVariant *)local_108);
    QVariant::~QVariant((QVariant *)&local_58);
    if (cVar6 != '\0') {
      QVariant::QVariant((QVariant *)local_108,true);
      QNetworkRequest::setAttribute
                (&local_118,AutoDeleteReplyOnFinishAttribute,(QVariant *)local_108);
      QVariant::~QVariant((QVariant *)local_108);
    }
  }
  QNetworkRequest::url((QNetworkRequest *)&local_108[0].shared);
  cVar6 = QUrl::isLocalFile();
  QUrl::~QUrl((QUrl *)&local_108[0].shared);
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  local_138 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_130 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::url((QNetworkRequest *)&local_108[0].shared);
  QUrl::scheme();
  QUrl::~QUrl((QUrl *)&local_108[0].shared);
  if ((local_128 == (undefined1 *)0xa) &&
     (QVar14.m_data = psStack_130, QVar14.m_size = 10, QVar19.m_data = "local+http",
     QVar19.m_size = 10, cVar7 = QtPrivate::equalStrings(QVar14,QVar19), pQVar4 = local_138,
     cVar7 != '\0')) {
    local_138 = (QArrayData *)0x0;
    psStack_130 = L"unix+http";
    local_128 = (undefined1 *)0x9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    local_108[0].shared = &DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::url((QNetworkRequest *)&local_108[0].shared);
    QUrl::setScheme((QString *)local_108[0].data);
    QNetworkRequest::setUrl(&local_118,(QUrl *)&local_108[0].shared);
    QUrl::~QUrl((QUrl *)&local_108[0].shared);
    op = local_10c;
  }
  if (op - HeadOperation < 2) {
    if (cVar6 != '\0') {
LAB_0017ff98:
      this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
      QNetworkReplyFileImpl::QNetworkReplyFileImpl
                (this_01,(QNetworkAccessManager *)this,&local_118,op);
      goto LAB_00180568;
    }
    if (local_128 == (undefined1 *)0x4) {
      QVar16.m_data = psStack_130;
      QVar16.m_size = 4;
      QVar21.m_data = "data";
      QVar21.m_size = 4;
      cVar6 = QtPrivate::equalStrings(QVar16,QVar21);
      if (cVar6 != '\0') {
        this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
        QNetworkReplyDataImpl::QNetworkReplyDataImpl
                  ((QNetworkReplyDataImpl *)this_01,(QObject *)this,&local_118,op);
        goto LAB_00180568;
      }
    }
    else if ((local_128 == (undefined1 *)0x3) &&
            (QVar15.m_data = psStack_130, QVar15.m_size = 3, QVar20.m_data = "qrc",
            QVar20.m_size = 3, cVar6 = QtPrivate::equalStrings(QVar15,QVar20), cVar6 != '\0'))
    goto LAB_0017ff98;
    QVariant::QVariant((QVariant *)&local_58,1);
    QNetworkRequest::attribute
              ((QVariant *)local_108,&local_118,CacheLoadControlAttribute,(QVariant *)&local_58);
    iVar9 = QVariant::toInt((bool *)local_108[0].data);
    QVariant::~QVariant((QVariant *)local_108);
    QVariant::~QVariant((QVariant *)&local_58);
    if (iVar9 == 3) {
      this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
      QNetworkReplyImpl::QNetworkReplyImpl((QNetworkReplyImpl *)this_01,(QObject *)this);
      pQVar1 = *(QNetworkReplyImplPrivate **)((QNetworkReplyImpl *)this_01 + 8);
      pDVar11 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
      pDVar2 = (pQVar1->super_QNetworkReplyPrivate).manager.wp.d;
      (pQVar1->super_QNetworkReplyPrivate).manager.wp.d = pDVar11;
      (pQVar1->super_QNetworkReplyPrivate).manager.wp.value = (QObject *)this;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(pDVar2);
        }
      }
      this_02 = (QNetworkAccessCacheBackend *)operator_new(0x18);
      QNetworkAccessCacheBackend::QNetworkAccessCacheBackend(this_02);
      pQVar1->backend = (QNetworkAccessBackend *)this_02;
      QNetworkAccessBackend::setManagerPrivate
                ((QNetworkAccessBackend *)this_02,*(QNetworkAccessManagerPrivate **)(this + 8));
      QObject::setParent(&pQVar1->backend->super_QObject);
      QNetworkAccessBackend::setReplyPrivate((QNetworkAccessBackend *)pQVar1->backend,pQVar1);
      QNetworkReplyImplPrivate::setup(pQVar1,local_10c,&local_118,outgoingData);
      goto LAB_00180568;
    }
  }
  local_140.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest(&local_140,&local_118);
  local_148.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::headers(&local_148);
  bVar8 = QHttpHeaders::contains((QHttpHeaders *)&local_148,ContentLength);
  if (((outgoingData != (QIODevice *)0x0) && (!bVar8)) &&
     (cVar6 = (**(code **)(*(long *)outgoingData + 0x60))(), cVar6 == '\0')) {
    iVar9 = (**(code **)(*(long *)outgoingData + 0x80))();
    QByteArray::number((longlong)local_108,iVar9);
    value.m_size = local_108[0]._16_8_;
    value.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_108[0]._8_8_;
    QHttpHeaders::append((QHttpHeaders *)&local_148,ContentLength,value);
    if ((QArrayData *)local_108[0]._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_108[0]._0_8_ = *(int *)local_108[0]._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_108[0]._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_108[0]._0_8_,1,0x10);
      }
    }
  }
  QVariant::QVariant((QVariant *)&local_58,0);
  QNetworkRequest::attribute
            ((QVariant *)local_108,&local_140,CookieLoadControlAttribute,(QVariant *)&local_58);
  iVar9 = QVariant::toInt((bool *)local_108[0].data);
  QVariant::~QVariant((QVariant *)local_108);
  QVariant::~QVariant((QVariant *)&local_58);
  if ((iVar9 == 0) && (pQVar3 = this_00->cookieJar, pQVar3 != (QNetworkCookieJar *)0x0)) {
    local_108[0]._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_108[0].shared = &DAT_aaaaaaaaaaaaaaaa;
    local_108[0]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::url((QNetworkRequest *)&local_58.shared);
    (**(code **)(*(long *)pQVar3 + 0x60))(local_108,pQVar3,&local_58);
    QUrl::~QUrl((QUrl *)&local_58.shared);
    if ((undefined1 *)local_108[0]._16_8_ != (undefined1 *)0x0) {
      QNetworkHeadersPrivate::fromCookieList
                ((QByteArray *)&local_58,(QList<QNetworkCookie> *)local_108);
      newValue.m_size = local_58._16_8_;
      newValue.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_58._8_8_;
      QHttpHeaders::replaceOrAppend((QHttpHeaders *)&local_148,Cookie,newValue);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,1,0x10);
        }
      }
    }
    QArrayDataPointer<QNetworkCookie>::~QArrayDataPointer
              ((QArrayDataPointer<QNetworkCookie> *)local_108);
  }
  QNetworkRequest::setHeaders(&local_140,(QHttpHeaders *)&local_148);
  memcpy(local_108,L"http",0xaa);
  pacVar12 = const(local_108,(char16_t (*) [17])local_5e,&local_138);
  if (pacVar12 == (char16_t (*) [17])local_5e) {
    this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
    QNetworkReplyImpl::QNetworkReplyImpl((QNetworkReplyImpl *)this_01,(QObject *)this);
    pQVar1 = *(QNetworkReplyImplPrivate **)((QNetworkReplyImpl *)this_01 + 8);
    pDVar11 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
    pDVar2 = (pQVar1->super_QNetworkReplyPrivate).manager.wp.d;
    (pQVar1->super_QNetworkReplyPrivate).manager.wp.d = pDVar11;
    (pQVar1->super_QNetworkReplyPrivate).manager.wp.value = (QObject *)this;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar2);
      }
    }
    op_00 = local_10c;
    pQVar13 = &QNetworkAccessManagerPrivate::findBackend(this_00,local_10c,&local_140)->
               super_QObject;
    pQVar1->backend = (QNetworkAccessBackend *)pQVar13;
    if (pQVar13 != (QObject *)0x0) {
      QObject::setParent(pQVar13);
      QNetworkAccessBackend::setReplyPrivate((QNetworkAccessBackend *)pQVar1->backend,pQVar1);
    }
    QNetworkRequest::sslConfiguration((QNetworkRequest *)&local_58.shared);
    QNetworkReply::setSslConfiguration
              ((QNetworkReply *)this_01,(QSslConfiguration *)&local_58.shared);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&local_58.shared);
    QNetworkReplyImplPrivate::setup(pQVar1,op_00,&local_140,outgoingData);
  }
  else {
    QVar17.m_data = &DAT_00000004;
    QVar17.m_size = (qsizetype)&local_138;
    cVar6 = QString::startsWith(QVar17,0x259e2b);
    if ((cVar6 == '\0') && (*(char *)(*(long *)(this + 8) + 0xf8) == '\x01')) {
      QNetworkRequest::url((QNetworkRequest *)&local_58.shared);
      bVar8 = QHstsCache::isKnownHost(&this_00->stsCache,(QUrl *)&local_58.shared);
      QUrl::~QUrl((QUrl *)&local_58.shared);
      if (bVar8) {
        local_150.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QNetworkRequest::url(&local_150);
        iVar9 = QUrl::port((int)&local_150);
        if (iVar9 == 0x50) {
          QUrl::setPort((int)&local_150);
        }
        QVar18.m_data = (storage_type *)0x5;
        QVar18.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar18);
        uVar5 = local_58.shared;
        QUrl::setScheme((QString *)&local_150);
        if ((QArrayData *)uVar5 != (QArrayData *)0x0) {
          LOCK();
          *(int *)uVar5 = *(int *)uVar5 + -1;
          UNLOCK();
          if (*(int *)uVar5 == 0) {
            QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
          }
        }
        QNetworkRequest::setUrl(&local_140,(QUrl *)&local_150);
        QUrl::~QUrl((QUrl *)&local_150);
      }
    }
    this_01 = (QNetworkReplyFileImpl *)operator_new(0x10);
    QNetworkReplyHttpImpl::QNetworkReplyHttpImpl
              ((QNetworkReplyHttpImpl *)this_01,(QNetworkAccessManager *)this,&local_140,&local_10c,
               outgoingData);
  }
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_148);
  QNetworkRequest::~QNetworkRequest(&local_140);
LAB_00180568:
  if (local_138 != (QArrayData *)0x0) {
    LOCK();
    (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_138,2,0x10);
    }
  }
  QNetworkRequest::~QNetworkRequest(&local_118);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QNetworkReply *)this_01;
}

Assistant:

QNetworkReply *QNetworkAccessManager::createRequest(QNetworkAccessManager::Operation op,
                                                    const QNetworkRequest &originalReq,
                                                    QIODevice *outgoingData)
{
    Q_D(QNetworkAccessManager);

    QNetworkRequest req(originalReq);
    if (redirectPolicy() != QNetworkRequest::NoLessSafeRedirectPolicy
        && req.attribute(QNetworkRequest::RedirectPolicyAttribute).isNull()) {
        req.setAttribute(QNetworkRequest::RedirectPolicyAttribute, redirectPolicy());
    }

#if QT_CONFIG(http) || defined (Q_OS_WASM)
    if (req.transferTimeoutAsDuration() == 0ms)
        req.setTransferTimeout(transferTimeoutAsDuration());
#endif

    if (autoDeleteReplies()
        && req.attribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute).isNull()) {
        req.setAttribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute, true);
    }

    bool isLocalFile = req.url().isLocalFile();
    QString scheme = req.url().scheme();

    // Remap local+http to unix+http to make further processing easier
    if (scheme == "local+http"_L1) {
        scheme = u"unix+http"_s;
        QUrl url = req.url();
        url.setScheme(scheme);
        req.setUrl(url);
    }

    // fast path for GET on file:// URLs
    // The QNetworkAccessFileBackend will right now only be used for PUT
    if (op == QNetworkAccessManager::GetOperation
     || op == QNetworkAccessManager::HeadOperation) {
        if (isLocalFile
#ifdef Q_OS_ANDROID
            || scheme == "assets"_L1
#endif
            || scheme == "qrc"_L1) {
            return new QNetworkReplyFileImpl(this, req, op);
        }

        if (scheme == "data"_L1)
            return new QNetworkReplyDataImpl(this, req, op);

        // A request with QNetworkRequest::AlwaysCache does not need any bearer management
        QNetworkRequest::CacheLoadControl mode =
            static_cast<QNetworkRequest::CacheLoadControl>(
                req.attribute(QNetworkRequest::CacheLoadControlAttribute,
                              QNetworkRequest::PreferNetwork).toInt());
        if (mode == QNetworkRequest::AlwaysCache) {
            // FIXME Implement a QNetworkReplyCacheImpl instead, see QTBUG-15106
            QNetworkReplyImpl *reply = new QNetworkReplyImpl(this);
            QNetworkReplyImplPrivate *priv = reply->d_func();
            priv->manager = this;
            priv->backend = new QNetworkAccessCacheBackend();
            priv->backend->setManagerPrivate(this->d_func());
            priv->backend->setParent(reply);
            priv->backend->setReplyPrivate(priv);
            priv->setup(op, req, outgoingData);
            return reply;
        }
    }
    QNetworkRequest request = req;
    auto h = request.headers();
#ifndef Q_OS_WASM // Content-length header is not allowed to be set by user in wasm
    if (!h.contains(QHttpHeaders::WellKnownHeader::ContentLength) &&
        outgoingData && !outgoingData->isSequential()) {
        // request has no Content-Length
        // but the data that is outgoing is random-access
        h.append(QHttpHeaders::WellKnownHeader::ContentLength,
                 QByteArray::number(outgoingData->size()));
    }
#endif
    if (static_cast<QNetworkRequest::LoadControl>
        (request.attribute(QNetworkRequest::CookieLoadControlAttribute,
                           QNetworkRequest::Automatic).toInt()) == QNetworkRequest::Automatic) {
        if (d->cookieJar) {
            QList<QNetworkCookie> cookies = d->cookieJar->cookiesForUrl(request.url());
            if (!cookies.isEmpty())
                h.replaceOrAppend(QHttpHeaders::WellKnownHeader::Cookie,
                                  QNetworkHeadersPrivate::fromCookieList(cookies));
        }
    }
    request.setHeaders(std::move(h));
#ifdef Q_OS_WASM
    Q_UNUSED(isLocalFile);
    // Support http, https, and relative urls
    if (scheme == "http"_L1 || scheme == "https"_L1 || scheme.isEmpty()) {
        QNetworkReplyWasmImpl *reply = new QNetworkReplyWasmImpl(this);
        QNetworkReplyWasmImplPrivate *priv = reply->d_func();
        priv->manager = this;
        priv->setup(op, request, outgoingData);
        return reply;
    }
#endif

#if QT_CONFIG(http)
    constexpr char16_t httpSchemes[][17] = {
        u"http",
        u"preconnect-http",
#ifndef QT_NO_SSL
        u"https",
        u"preconnect-https",
#endif
        u"unix+http",
    };
    // Since Qt 5 we use the new QNetworkReplyHttpImpl
    if (std::find(std::begin(httpSchemes), std::end(httpSchemes), scheme) != std::end(httpSchemes)) {

#ifndef QT_NO_SSL
        const bool isLocalSocket = scheme.startsWith("unix"_L1);
        if (!isLocalSocket && isStrictTransportSecurityEnabled()
            && d->stsCache.isKnownHost(request.url())) {
            QUrl stsUrl(request.url());
            // RFC6797, 8.3:
            // The UA MUST replace the URI scheme with "https" [RFC2818],
            // and if the URI contains an explicit port component of "80",
            // then the UA MUST convert the port component to be "443", or
            // if the URI contains an explicit port component that is not
            // equal to "80", the port component value MUST be preserved;
            // otherwise,
            // if the URI does not contain an explicit port component, the UA
            // MUST NOT add one.
            if (stsUrl.port() == 80)
                stsUrl.setPort(443);
            stsUrl.setScheme("https"_L1);
            request.setUrl(stsUrl);
        }
#endif
        QNetworkReplyHttpImpl *reply = new QNetworkReplyHttpImpl(this, request, op, outgoingData);
        return reply;
    }
#endif // QT_CONFIG(http)

    // first step: create the reply
    QNetworkReplyImpl *reply = new QNetworkReplyImpl(this);
    QNetworkReplyImplPrivate *priv = reply->d_func();
    priv->manager = this;

    // second step: fetch cached credentials
    // This is not done for the time being, we should use signal emissions to request
    // the credentials from cache.

    // third step: find a backend
    priv->backend = d->findBackend(op, request);

    if (priv->backend) {
        priv->backend->setParent(reply);
        priv->backend->setReplyPrivate(priv);
    }

#ifndef QT_NO_SSL
    reply->setSslConfiguration(request.sslConfiguration());
#endif

    // fourth step: setup the reply
    priv->setup(op, request, outgoingData);

    return reply;
}